

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O0

void PatternMatch_Expression(KonohaContext *kctx,KonohaStack *sfp)

{
  undefined4 uVar1;
  ksymbol_t kVar2;
  undefined4 uVar3;
  kNode *pkVar4;
  char *in_RSI;
  KonohaContext *in_RDI;
  kNode *expr;
  int returnIdx;
  int endIdx;
  int beginIdx;
  kArray *tokenList;
  ksymbol_t name;
  kNode *stmt;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  ksymbol_t keyid;
  kNameSpace *ns;
  undefined4 in_stack_ffffffffffffffe0;
  
  pkVar4 = *(kNode **)(in_RSI + 0x10);
  uVar1 = (undefined4)*(undefined8 *)(in_RSI + 0x28);
  ns = *(kNameSpace **)(in_RSI + 0x30);
  kVar2 = (ksymbol_t)*(undefined8 *)(in_RSI + 0x48);
  uVar3 = (undefined4)*(undefined8 *)(in_RSI + 0x68);
  (*(in_RDI->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"PatternMatch_Expression",0x1b,"tracing..");
  keyid = kVar2;
  kNode_GetNameSpace(in_RDI,pkVar4);
  pkVar4 = ParseNewNode((KonohaContext *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),ns,
                        (kArray *)CONCAT44(keyid,uVar3),
                        (int *)CONCAT44(kVar2,in_stack_ffffffffffffffc8),
                        (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                        (ParseOption)in_stack_ffffffffffffffc0,in_RSI);
  if (pkVar4 != *(kNode **)((*in_RDI->runtimeModels)[1].freeModel + 0xc0)) {
    kNode_AddParsedObject
              ((KonohaContext *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),(kNode *)ns,keyid,
               (kObject_conflict *)CONCAT44(kVar2,in_stack_ffffffffffffffc8));
  }
  *(long *)(in_RSI + -0x38) = (long)(int)kVar2;
  return;
}

Assistant:

static KMETHOD PatternMatch_Expression(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_PatternMatch(stmt, name, tokenList, beginIdx, endIdx);
	int returnIdx = beginIdx;
	kNode *expr = ParseNewNode(kctx, kNode_ns(stmt), tokenList, &returnIdx, endIdx, (ParseOption)(ParseExpressionOption|OnlyPatternMatch), NULL);
	if(expr != K_NULLNODE) {
		kNode_AddParsedObject(kctx, stmt, name, UPCAST(expr));
	}
	KReturnUnboxValue(returnIdx);
}